

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_widget.c
# Opt level: O0

void menu_widget_layer_update(ugui_layer_t *layer,void *graphics_ctx,void *layer_ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ugui_rect_t *puVar5;
  int local_128;
  ugui_size_t local_122;
  ugui_point_t local_11e;
  byte local_119;
  undefined1 local_118 [7];
  uint8_t i;
  char data [64];
  char title [64];
  char header [64];
  uint16_t local_4c;
  uint16_t local_4a;
  uint16_t local_48;
  uint16_t local_46;
  ugui_rect_t cell_bounds;
  int32_t min_rows;
  int32_t max_rows;
  int32_t row_height;
  int32_t header_height;
  int32_t num_rows;
  ugui_rect_t *bounds;
  ugui_menu_widget_t *menu_widget;
  void *layer_ctx_local;
  void *graphics_ctx_local;
  ugui_layer_t *layer_local;
  
  puVar5 = ugui_layer_get_bounds(layer);
  iVar1 = (**(code **)((long)layer_ctx + 0x30))(layer_ctx,*(undefined8 *)((long)layer_ctx + 0x58));
  iVar2 = (**(code **)((long)layer_ctx + 8))(layer_ctx,*(undefined8 *)((long)layer_ctx + 0x58));
  iVar3 = (**(code **)((long)layer_ctx + 0x10))(layer_ctx,*(undefined8 *)((long)layer_ctx + 0x58));
  iVar4 = (uint)puVar5->h - iVar2;
  cell_bounds._4_4_ = iVar4 / iVar3;
  local_128 = cell_bounds._4_4_;
  if (iVar1 < (int)cell_bounds._4_4_) {
    local_128 = iVar1;
  }
  cell_bounds.x = (undefined2)local_128;
  cell_bounds.y = local_128._2_2_;
  local_4c = 0;
  local_48 = puVar5->w;
  local_4a = (short)iVar2;
  local_46 = (uint16_t)iVar3;
  (**(code **)((long)layer_ctx + 0x38))
            (layer_ctx,title + 0x38,(long)iVar4 % (long)iVar3 & 0xffffffff);
  (**(code **)((long)layer_ctx + 0x18))(graphics_ctx,puVar5,title + 0x38);
  for (local_119 = 0; (int)(uint)local_119 < (int)cell_bounds._0_4_; local_119 = local_119 + 1) {
    local_4a = (short)iVar2 + (ushort)local_119 * (uint16_t)iVar3;
    (**(code **)((long)layer_ctx + 0x40))
              (layer_ctx,(ushort)local_119 + (short)*(undefined4 *)((long)layer_ctx + 0x54),
               data + 0x38,local_118);
    (**(code **)((long)layer_ctx + 0x20))(graphics_ctx,&local_4c,data + 0x38,local_118);
    if ((uint)local_119 + *(int *)((long)layer_ctx + 0x54) == *(int *)((long)layer_ctx + 0x50)) {
      local_11e.y = local_4a;
      local_11e.x = local_4c;
      local_122.h = local_46;
      local_122.w = local_48;
      ugui_graphics_inverse_rect((ugui_graphics_t *)graphics_ctx,local_11e,local_122);
    }
  }
  return;
}

Assistant:

static void menu_widget_layer_update(ugui_layer_t* layer, void* graphics_ctx, void* layer_ctx)
{
	ugui_menu_widget_t* menu_widget = (ugui_menu_widget_t*) layer_ctx;
	ugui_rect_t* bounds = ugui_layer_get_bounds(layer);

	int32_t num_rows = menu_widget->data_callbacks.get_num_rows(menu_widget, menu_widget->data);
	int32_t header_height = menu_widget->draw_callbacks.get_header_height(menu_widget, menu_widget->data);
	int32_t row_height = menu_widget->draw_callbacks.get_cell_height(menu_widget, menu_widget->data);

	int32_t max_rows = (bounds->h - header_height) / row_height;
	int32_t min_rows = (num_rows < max_rows) ? num_rows : max_rows;

	ugui_rect_t cell_bounds;
	cell_bounds.x = 0;
	cell_bounds.y = header_height;
	cell_bounds.w = bounds->w;
	cell_bounds.h = row_height;

	char header[64];
	char title[64];
	char data[64];

	//Draw header
	menu_widget->data_callbacks.get_header(menu_widget, header);
	menu_widget->draw_callbacks.draw_header(graphics_ctx, bounds, header);

	//Draw cells
	//TODO: support for 2d cells
	for (uint8_t i = 0; i < min_rows; i++) {
		//Calculate row offset in pixels
		cell_bounds.y = header_height + i * row_height;

		menu_widget->data_callbacks.get_data(menu_widget, i + menu_widget->offset, title, data);
		menu_widget->draw_callbacks.draw_row(graphics_ctx, &cell_bounds, title, data);

		//Highlight selected cell
		if ((i + menu_widget->offset) == menu_widget->selected) {
			ugui_graphics_inverse_rect(graphics_ctx,
			(ugui_point_t) {.x = cell_bounds.x, .y = cell_bounds.y},
			(ugui_size_t) {.w = cell_bounds.w, .h = cell_bounds.h});
		}
	}
}